

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_reroll_item(command_conflict *cmd)

{
  bitflag bVar1;
  uint16_t uVar2;
  object *poVar3;
  object *poVar4;
  object *poVar5;
  loc_conflict lVar6;
  _Bool _Var7;
  wchar_t wVar8;
  bitflag notice;
  loc_conflict grid;
  uint16_t oidx;
  object *known_obj;
  object *next;
  object *prev;
  object *poStack_30;
  char ch;
  object *new;
  object *obj;
  wchar_t local_18;
  wchar_t update;
  wchar_t roll_choice;
  _Bool great;
  _Bool good;
  command_conflict *cmd_local;
  
  update._3_1_ = 0;
  update._2_1_ = 0;
  local_18 = L'\0';
  obj._4_4_ = 0;
  _roll_choice = cmd;
  wVar8 = cmd_get_arg_item((command *)cmd,"item",&new);
  if (wVar8 != L'\0') {
    _Var7 = get_item(&new,"Reroll which item? ","You have nothing to reroll.",_roll_choice->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var7) {
      return;
    }
    cmd_set_arg_item((command *)_roll_choice,"item",new);
  }
  wVar8 = cmd_get_arg_choice((command *)_roll_choice,"choice",&local_18);
  if (wVar8 != L'\0') {
    _Var7 = get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ",(char *)((long)&prev + 7));
    if (!_Var7) {
      return;
    }
    if ((prev._7_1_ == 'n') || (prev._7_1_ == 'N')) {
      local_18 = L'\0';
    }
    else if ((prev._7_1_ == 'g') || (prev._7_1_ == 'G')) {
      local_18 = L'\x01';
    }
    else {
      if ((prev._7_1_ != 'e') && (prev._7_1_ != 'E')) {
        return;
      }
      local_18 = L'\x02';
    }
    cmd_set_arg_choice((command *)_roll_choice,"choice",local_18);
  }
  if (local_18 == L'\0') {
    update._3_1_ = 0;
    update._2_1_ = 0;
  }
  else {
    if (local_18 == L'\x01') {
      update._2_1_ = 0;
    }
    else {
      if (local_18 != L'\x02') {
        return;
      }
      update._2_1_ = 1;
    }
    update._3_1_ = 1;
  }
  if (new->artifact == (artifact *)0x0) {
    poStack_30 = object_new();
    object_prep(poStack_30,new->kind,(int)player->depth,RANDOMISE);
    apply_magic(poStack_30,(int)player->depth,false,(_Bool)(update._3_1_ & 1),
                (_Bool)(update._2_1_ & 1),false);
    poVar3 = new->prev;
    poVar4 = new->next;
    poVar5 = new->known;
    uVar2 = new->oidx;
    lVar6 = new->grid;
    bVar1 = new->notice;
    mem_free(new->slays);
    new->slays = (_Bool *)0x0;
    mem_free(new->brands);
    new->brands = (_Bool *)0x0;
    mem_free(new->curses);
    new->curses = (curse_data *)0x0;
    object_copy(new,poStack_30);
    new->prev = poVar3;
    new->next = poVar4;
    new->known = poVar5;
    new->known->ego = new->ego;
    new->oidx = uVar2;
    new->grid = lVar6;
    new->notice = bVar1;
    new->origin = '\x13';
    wVar8 = cmd_get_arg_choice((command *)_roll_choice,"update",(int *)((long)&obj + 4));
    if ((wVar8 == L'\0') && (obj._4_4_ == 0)) {
      wiz_play_item_notify_changed();
    }
    else {
      wiz_play_item_standard_upkeep(player,new);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void do_cmd_wiz_reroll_item(struct command *cmd)
{
	bool good = false;
	bool great = false;
	int roll_choice = 0;
	int update = 0;
	struct object *obj;
	struct object *new;

	/* Get the item to reroll. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Reroll which item? ",
				"You have nothing to reroll.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get the type of roll to use. */
	if (cmd_get_arg_choice(cmd, "choice", &roll_choice) != CMD_OK) {
		char ch;

		if (!get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ", &ch)) {
			return;
		}
		if (ch == 'n' || ch == 'N') {
			roll_choice = 0;
		} else if (ch == 'g' || ch == 'G') {
			roll_choice = 1;
		} else if (ch == 'e' || ch == 'E') {
			roll_choice = 2;
		} else {
			return;
		}
		cmd_set_arg_choice(cmd, "choice", roll_choice);
	}
	if (roll_choice == 0) {
		good = false;
		great = false;
	} else if (roll_choice == 1) {
		good = true;
		great = false;
	} else if (roll_choice == 2) {
		good = true;
		great = true;
	} else {
		return;
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) {
		return;
	}

	/* Get a new object with a clean slate. */
	new = object_new();

	/* Reroll based on old kind and player's depth.  Then apply magic. */
	object_prep(new, obj->kind, player->depth, RANDOMISE);
	apply_magic(new, player->depth, false, good, great, false);

	/* Copy over changes to the original. */
	{
		/* Record old pile information. */
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known_obj = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		/* Free slays, brands, and curses on the old object by hand. */
		mem_free(obj->slays);
		obj->slays = NULL;
		mem_free(obj->brands);
		obj->brands = NULL;
		mem_free(obj->curses);
		obj->curses = NULL;

		/* Copy over; pile information needs to be restored. */
		object_copy(obj, new);
		obj->prev = prev;
		obj->next = next;
		obj->known = known_obj;
		obj->known->ego = obj->ego;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
	}

	/* Mark as cheat */
	obj->origin = ORIGIN_CHEAT;

	/* Flag what needs to be updated. */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}

	/* Free the copy. */
	object_delete(cave, player->cave, &new);
}